

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_rar.c
# Opt level: O0

void test_read_format_rar_multivolume_skip(void)

{
  archive_entry *paVar1;
  archive *_a;
  char *file;
  char *v1;
  archive *a;
  archive_entry *ae;
  int file3_size;
  int file2_size;
  int file1_size;
  char *reffiles [5];
  archive_entry *in_stack_ffffffffffffff88;
  void *pvVar2;
  archive_entry *paVar3;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar4;
  uint in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  char **in_stack_ffffffffffffffa0;
  archive *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  wchar_t wVar5;
  archive_entry *in_stack_ffffffffffffffc0;
  int iVar6;
  int iVar7;
  wchar_t in_stack_ffffffffffffffd8;
  
  wVar5 = (wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  memcpy(&stack0xffffffffffffffd8,&PTR_anon_var_dwarf_1148f_003129c0,0x28);
  iVar7 = 0xe67416a;
  iVar6 = 0x4e8f;
  extract_reference_files((char **)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  paVar1 = (archive_entry *)archive_read_new();
  assertion_assert((char *)in_stack_ffffffffffffffa0,
                   (wchar_t)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff98,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff88);
  archive_read_support_filter_all((archive *)in_stack_ffffffffffffff88);
  assertion_assert((char *)in_stack_ffffffffffffffa0,
                   (wchar_t)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff98,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff88);
  archive_read_support_format_all((archive *)in_stack_ffffffffffffff88);
  assertion_assert((char *)in_stack_ffffffffffffffa0,
                   (wchar_t)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff98,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff88);
  archive_read_open_filenames
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98);
  assertion_assert((char *)in_stack_ffffffffffffffa0,
                   (wchar_t)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff98,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff88);
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (archive_entry **)in_stack_ffffffffffffff88);
  assertion_assert((char *)in_stack_ffffffffffffffa0,
                   (wchar_t)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff98,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff88);
  archive_entry_pathname(in_stack_ffffffffffffff88);
  pvVar2 = (void *)0x0;
  uVar4 = 0;
  assertion_equal_string
            ((char *)paVar1,wVar5,(char *)in_stack_ffffffffffffffa8,
             (char *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             (char *)((ulong)in_stack_ffffffffffffff94 << 0x20),(void *)CONCAT44(iVar7,iVar6),
             in_stack_ffffffffffffffd8);
  archive_entry_mtime(in_stack_ffffffffffffffc0);
  assertion_assert((char *)in_stack_ffffffffffffffa0,
                   (wchar_t)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff98,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),pvVar2);
  archive_entry_ctime(in_stack_ffffffffffffffc0);
  assertion_assert((char *)in_stack_ffffffffffffffa0,
                   (wchar_t)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff98,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),pvVar2);
  archive_entry_atime(in_stack_ffffffffffffffc0);
  assertion_assert((char *)in_stack_ffffffffffffffa0,
                   (wchar_t)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff98,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),pvVar2);
  _a = (archive *)(long)iVar7;
  archive_entry_size(in_stack_ffffffffffffffc0);
  assertion_equal_int((char *)in_stack_ffffffffffffffa8,
                      (wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),0,(char *)0x1995a9,
                      in_stack_ffffffffffffffc0);
  archive_entry_mode(in_stack_ffffffffffffffc0);
  assertion_equal_int((char *)in_stack_ffffffffffffffa8,
                      (wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),0,(char *)0x1995e6,
                      in_stack_ffffffffffffffc0);
  archive_entry_is_encrypted(in_stack_ffffffffffffffc0);
  assertion_equal_int((char *)in_stack_ffffffffffffffa8,
                      (wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),0,(char *)0x19961f,
                      in_stack_ffffffffffffffc0);
  archive_read_has_encrypted_entries(_a);
  paVar3 = paVar1;
  assertion_equal_int((char *)in_stack_ffffffffffffffa8,
                      (wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),(longlong)paVar1,
                      (char *)0x199657,in_stack_ffffffffffffffc0);
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffff94,uVar4),(archive_entry **)paVar1);
  assertion_assert((char *)in_stack_ffffffffffffffa0,(wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),paVar1);
  archive_entry_pathname(paVar1);
  pvVar2 = (void *)0x0;
  uVar4 = 0;
  assertion_equal_string
            ((char *)paVar3,wVar5,(char *)in_stack_ffffffffffffffa8,
             (char *)in_stack_ffffffffffffffa0,(char *)_a,
             (char *)((ulong)in_stack_ffffffffffffff94 << 0x20),(void *)CONCAT44(iVar7,iVar6),
             in_stack_ffffffffffffffd8);
  archive_entry_mtime(in_stack_ffffffffffffffc0);
  assertion_assert((char *)in_stack_ffffffffffffffa0,(wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),pvVar2);
  archive_entry_ctime(in_stack_ffffffffffffffc0);
  assertion_assert((char *)in_stack_ffffffffffffffa0,(wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),pvVar2);
  archive_entry_atime(in_stack_ffffffffffffffc0);
  assertion_assert((char *)in_stack_ffffffffffffffa0,(wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),pvVar2);
  file = (char *)(long)iVar6;
  archive_entry_size(in_stack_ffffffffffffffc0);
  assertion_equal_int((char *)in_stack_ffffffffffffffa8,(wchar_t)((ulong)file >> 0x20),(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),0,(char *)0x199798,
                      in_stack_ffffffffffffffc0);
  archive_entry_mode(in_stack_ffffffffffffffc0);
  assertion_equal_int((char *)in_stack_ffffffffffffffa8,(wchar_t)((ulong)file >> 0x20),(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),0,(char *)0x1997d5,
                      in_stack_ffffffffffffffc0);
  archive_entry_is_encrypted(in_stack_ffffffffffffffc0);
  assertion_equal_int((char *)in_stack_ffffffffffffffa8,(wchar_t)((ulong)file >> 0x20),(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),0,(char *)0x19980e,
                      in_stack_ffffffffffffffc0);
  archive_read_has_encrypted_entries(_a);
  paVar1 = paVar3;
  assertion_equal_int((char *)in_stack_ffffffffffffffa8,(wchar_t)((ulong)file >> 0x20),(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),(longlong)paVar3,
                      (char *)0x199846,in_stack_ffffffffffffffc0);
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffff94,uVar4),(archive_entry **)paVar3);
  assertion_assert(file,(wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),paVar3);
  archive_entry_pathname(paVar3);
  pvVar2 = (void *)0x0;
  uVar4 = 0;
  assertion_equal_string
            ((char *)paVar1,wVar5,(char *)in_stack_ffffffffffffffa8,file,(char *)_a,
             (char *)((ulong)in_stack_ffffffffffffff94 << 0x20),(void *)CONCAT44(iVar7,iVar6),
             in_stack_ffffffffffffffd8);
  archive_entry_mtime(in_stack_ffffffffffffffc0);
  assertion_assert(file,(wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),pvVar2);
  archive_entry_ctime(in_stack_ffffffffffffffc0);
  assertion_assert(file,(wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),pvVar2);
  archive_entry_atime(in_stack_ffffffffffffffc0);
  assertion_assert(file,(wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),pvVar2);
  archive_entry_size(in_stack_ffffffffffffffc0);
  assertion_equal_int((char *)in_stack_ffffffffffffffa8,(wchar_t)((ulong)file >> 0x20),(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),0,(char *)0x19997a,
                      in_stack_ffffffffffffffc0);
  archive_entry_mode(in_stack_ffffffffffffffc0);
  assertion_equal_int((char *)in_stack_ffffffffffffffa8,(wchar_t)((ulong)file >> 0x20),(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),0,(char *)0x1999b7,
                      in_stack_ffffffffffffffc0);
  archive_entry_is_encrypted(in_stack_ffffffffffffffc0);
  assertion_equal_int((char *)in_stack_ffffffffffffffa8,(wchar_t)((ulong)file >> 0x20),(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),0,(char *)0x1999f0,
                      in_stack_ffffffffffffffc0);
  archive_read_has_encrypted_entries(_a);
  paVar3 = paVar1;
  assertion_equal_int((char *)in_stack_ffffffffffffffa8,(wchar_t)((ulong)file >> 0x20),(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),(longlong)paVar1,
                      (char *)0x199a28,in_stack_ffffffffffffffc0);
  archive_entry_symlink(paVar1);
  paVar1 = (archive_entry *)0x0;
  uVar4 = 0;
  assertion_equal_string
            ((char *)paVar3,wVar5,(char *)in_stack_ffffffffffffffa8,file,(char *)_a,
             (char *)((ulong)in_stack_ffffffffffffff94 << 0x20),(void *)CONCAT44(iVar7,iVar6),
             in_stack_ffffffffffffffd8);
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffff94,uVar4),(archive_entry **)paVar1);
  assertion_assert(file,(wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),paVar1);
  archive_entry_pathname(paVar1);
  pvVar2 = (void *)0x0;
  uVar4 = 0;
  assertion_equal_string
            ((char *)paVar3,wVar5,(char *)in_stack_ffffffffffffffa8,file,(char *)_a,
             (char *)((ulong)in_stack_ffffffffffffff94 << 0x20),(void *)CONCAT44(iVar7,iVar6),
             in_stack_ffffffffffffffd8);
  archive_entry_mtime(in_stack_ffffffffffffffc0);
  assertion_assert(file,(wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),pvVar2);
  archive_entry_ctime(in_stack_ffffffffffffffc0);
  assertion_assert(file,(wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),pvVar2);
  archive_entry_atime(in_stack_ffffffffffffffc0);
  assertion_assert(file,(wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),pvVar2);
  v1 = (char *)0x14;
  archive_entry_size(in_stack_ffffffffffffffc0);
  assertion_equal_int(v1,(wchar_t)((ulong)file >> 0x20),(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),0,(char *)0x199bb0,
                      in_stack_ffffffffffffffc0);
  archive_entry_mode(in_stack_ffffffffffffffc0);
  assertion_equal_int(v1,(wchar_t)((ulong)file >> 0x20),(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),0,(char *)0x199bed,
                      in_stack_ffffffffffffffc0);
  archive_entry_is_encrypted(in_stack_ffffffffffffffc0);
  assertion_equal_int(v1,(wchar_t)((ulong)file >> 0x20),(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),0,(char *)0x199c26,
                      in_stack_ffffffffffffffc0);
  archive_read_has_encrypted_entries(_a);
  paVar1 = paVar3;
  assertion_equal_int(v1,(wchar_t)((ulong)file >> 0x20),(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),(longlong)paVar3,
                      (char *)0x199c5e,in_stack_ffffffffffffffc0);
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffff94,uVar4),(archive_entry **)paVar3);
  assertion_assert(file,(wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),paVar3);
  archive_entry_pathname(paVar3);
  pvVar2 = (void *)0x0;
  uVar4 = 0;
  assertion_equal_string
            ((char *)paVar1,wVar5,v1,file,(char *)_a,
             (char *)((ulong)in_stack_ffffffffffffff94 << 0x20),(void *)CONCAT44(iVar7,iVar6),
             in_stack_ffffffffffffffd8);
  archive_entry_mtime(in_stack_ffffffffffffffc0);
  assertion_assert(file,(wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),pvVar2);
  archive_entry_ctime(in_stack_ffffffffffffffc0);
  assertion_assert(file,(wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),pvVar2);
  archive_entry_atime(in_stack_ffffffffffffffc0);
  assertion_assert(file,(wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),pvVar2);
  wVar5 = iVar6 >> 0x1f;
  archive_entry_size(in_stack_ffffffffffffffc0);
  assertion_equal_int(v1,(wchar_t)((ulong)file >> 0x20),(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),0,(char *)0x199d9f,
                      in_stack_ffffffffffffffc0);
  archive_entry_mode(in_stack_ffffffffffffffc0);
  assertion_equal_int(v1,(wchar_t)((ulong)file >> 0x20),(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),0,(char *)0x199ddc,
                      in_stack_ffffffffffffffc0);
  archive_entry_is_encrypted(in_stack_ffffffffffffffc0);
  assertion_equal_int(v1,(wchar_t)((ulong)file >> 0x20),(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),0,(char *)0x199e15,
                      in_stack_ffffffffffffffc0);
  archive_read_has_encrypted_entries(_a);
  paVar3 = paVar1;
  assertion_equal_int(v1,(wchar_t)((ulong)file >> 0x20),(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),(longlong)paVar1,
                      (char *)0x199e4d,in_stack_ffffffffffffffc0);
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffff94,uVar4),(archive_entry **)paVar1);
  assertion_assert(file,(wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),paVar1);
  archive_entry_pathname(paVar1);
  pvVar2 = (void *)0x0;
  uVar4 = 0;
  assertion_equal_string
            ((char *)paVar3,wVar5,v1,file,(char *)_a,
             (char *)((ulong)in_stack_ffffffffffffff94 << 0x20),(void *)CONCAT44(iVar7,iVar6),
             in_stack_ffffffffffffffd8);
  archive_entry_mtime(in_stack_ffffffffffffffc0);
  assertion_assert(file,(wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),pvVar2);
  archive_entry_ctime(in_stack_ffffffffffffffc0);
  assertion_assert(file,(wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),pvVar2);
  archive_entry_atime(in_stack_ffffffffffffffc0);
  assertion_assert(file,(wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),pvVar2);
  archive_entry_size(in_stack_ffffffffffffffc0);
  assertion_equal_int(v1,(wchar_t)((ulong)file >> 0x20),(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),0,(char *)0x199f81,
                      in_stack_ffffffffffffffc0);
  archive_entry_mode(in_stack_ffffffffffffffc0);
  assertion_equal_int(v1,(wchar_t)((ulong)file >> 0x20),(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),0,(char *)0x199fbe,
                      in_stack_ffffffffffffffc0);
  archive_entry_is_encrypted(in_stack_ffffffffffffffc0);
  assertion_equal_int(v1,(wchar_t)((ulong)file >> 0x20),(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),0,(char *)0x199ff7,
                      in_stack_ffffffffffffffc0);
  archive_read_has_encrypted_entries(_a);
  paVar1 = paVar3;
  assertion_equal_int(v1,(wchar_t)((ulong)file >> 0x20),(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),(longlong)paVar3,
                      (char *)0x19a02f,in_stack_ffffffffffffffc0);
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffff94,uVar4),(archive_entry **)paVar3);
  assertion_assert(file,(wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),paVar3);
  archive_entry_pathname(paVar3);
  pvVar2 = (void *)0x0;
  uVar4 = 0;
  assertion_equal_string
            ((char *)paVar1,wVar5,v1,file,(char *)_a,
             (char *)((ulong)in_stack_ffffffffffffff94 << 0x20),(void *)CONCAT44(iVar7,iVar6),
             in_stack_ffffffffffffffd8);
  archive_entry_mtime(in_stack_ffffffffffffffc0);
  assertion_assert(file,(wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),pvVar2);
  archive_entry_ctime(in_stack_ffffffffffffffc0);
  assertion_assert(file,(wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),pvVar2);
  archive_entry_atime(in_stack_ffffffffffffffc0);
  assertion_assert(file,(wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),pvVar2);
  archive_entry_size(in_stack_ffffffffffffffc0);
  assertion_equal_int(v1,(wchar_t)((ulong)file >> 0x20),(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),0,(char *)0x19a163,
                      in_stack_ffffffffffffffc0);
  archive_entry_mode(in_stack_ffffffffffffffc0);
  assertion_equal_int(v1,(wchar_t)((ulong)file >> 0x20),(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),0,(char *)0x19a1a0,
                      in_stack_ffffffffffffffc0);
  archive_entry_is_encrypted(in_stack_ffffffffffffffc0);
  assertion_equal_int(v1,(wchar_t)((ulong)file >> 0x20),(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),0,(char *)0x19a1d9,
                      in_stack_ffffffffffffffc0);
  archive_read_has_encrypted_entries(_a);
  paVar3 = paVar1;
  assertion_equal_int(v1,(wchar_t)((ulong)file >> 0x20),(longlong)_a,
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),(longlong)paVar1,
                      (char *)0x19a211,in_stack_ffffffffffffffc0);
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffff94,uVar4),(archive_entry **)paVar1);
  assertion_assert(file,(wchar_t)((ulong)_a >> 0x20),(wchar_t)_a,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),paVar1);
  wVar5 = (wchar_t)((ulong)file >> 0x20);
  archive_file_count((archive *)paVar3);
  assertion_equal_int(v1,wVar5,(longlong)_a,(char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),0,
                      (char *)0x19a289,in_stack_ffffffffffffffc0);
  archive_read_close((archive *)0x19a293);
  assertion_equal_int(v1,wVar5,(longlong)_a,(char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),
                      (longlong)paVar3,(char *)0x19a2c2,in_stack_ffffffffffffffc0);
  archive_read_free((archive *)0x19a2cc);
  assertion_equal_int(v1,wVar5,(longlong)_a,(char *)CONCAT44(in_stack_ffffffffffffff94,uVar4),0,
                      (char *)0x19a2fa,in_stack_ffffffffffffffc0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_rar_multivolume_skip)
{
  const char *reffiles[] =
  {
    "test_read_format_rar_multivolume.part0001.rar",
    "test_read_format_rar_multivolume.part0002.rar",
    "test_read_format_rar_multivolume.part0003.rar",
    "test_read_format_rar_multivolume.part0004.rar",
    NULL
  };
  int file1_size = 241647978;
  int file2_size = 20111;
  int file3_size = 20;
  struct archive_entry *ae;
  struct archive *a;

  extract_reference_files(reffiles);
  assert((a = archive_read_new()) != NULL);
  assertA(0 == archive_read_support_filter_all(a));
  assertA(0 == archive_read_support_format_all(a));
  assertA(0 == archive_read_open_filenames(a, reffiles, 10240));

  /* First header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("ppmd_lzss_conversion_test.txt",
                    archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(file1_size, archive_entry_size(ae));
  assertEqualInt(33188, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

  /* Second header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("LibarchiveAddingTest.html", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(file2_size, archive_entry_size(ae));
  assertEqualInt(33188, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

  /* Third header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testlink", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(0, archive_entry_size(ae));
  assertEqualInt(41471, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
  assertEqualString("LibarchiveAddingTest.html", archive_entry_symlink(ae));

  /* Fourth header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testdir/test.txt", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(file3_size, archive_entry_size(ae));
  assertEqualInt(33188, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

  /* Fifth header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testdir/LibarchiveAddingTest.html",
                    archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(file2_size, archive_entry_size(ae));
  assertEqualInt(33188, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

  /* Sixth header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testdir", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(0, archive_entry_size(ae));
  assertEqualInt(16877, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

  /* Seventh header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testemptydir", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(0, archive_entry_size(ae));
  assertEqualInt(16877, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

  /* Test EOF */
  assertA(1 == archive_read_next_header(a, &ae));
  assertEqualInt(7, archive_file_count(a));
  assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
  assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}